

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void __thiscall
duckdb::HistogramBinState<bool>::InitializeBins<duckdb::HistogramFunctor>
          (HistogramBinState<bool> *this,Vector *bin_vector,idx_t count,idx_t pos,
          AggregateInputData *aggr_input)

{
  size_type __n;
  sel_t *psVar1;
  vector<bool,_std::allocator<bool>_> *this_00;
  unsafe_vector<bool> *puVar2;
  unsafe_vector<idx_t> *puVar3;
  Vector *this_01;
  idx_t count_00;
  BinderException *pBVar4;
  ulong uVar5;
  ulong uVar6;
  size_type sVar7;
  bool bVar8;
  reference rVar9;
  reference rVar10;
  allocator local_e1;
  UnifiedVectorFormat bin_child_data;
  string local_98;
  UnifiedVectorFormat bin_data;
  
  puVar2 = (unsafe_vector<bool> *)operator_new(0x28);
  (puVar2->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = 0;
  *(undefined8 *)
   ((long)&(puVar2->super_vector<bool,_std::allocator<bool>_>).
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base + 8) = 0;
  (puVar2->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(undefined8 *)
   ((long)&(puVar2->super_vector<bool,_std::allocator<bool>_>).
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base + 8) = 0;
  (puVar2->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  this->bin_boundaries = puVar2;
  puVar3 = (unsafe_vector<idx_t> *)operator_new(0x18);
  (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->counts = puVar3;
  UnifiedVectorFormat::UnifiedVectorFormat(&bin_data);
  Vector::ToUnifiedFormat(bin_vector,count,&bin_data);
  if ((bin_data.sel)->sel_vector != (sel_t *)0x0) {
    pos = (idx_t)(bin_data.sel)->sel_vector[pos];
  }
  uVar6 = *(ulong *)(bin_data.data + pos * 0x10);
  __n = *(size_type *)(bin_data.data + pos * 0x10 + 8);
  if ((bin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
       (unsigned_long *)0x0) &&
     ((bin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[pos >> 6] >>
       (pos & 0x3f) & 1) == 0)) {
    pBVar4 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&bin_child_data,"Histogram bin list cannot be NULL",(allocator *)&local_98)
    ;
    BinderException::BinderException(pBVar4,(string *)&bin_child_data);
    __cxa_throw(pBVar4,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_01 = ListVector::GetEntry(bin_vector);
  count_00 = ListVector::GetListSize(bin_vector);
  UnifiedVectorFormat::UnifiedVectorFormat(&bin_child_data);
  Vector::ToUnifiedFormat(this_01,count_00,&bin_child_data);
  ::std::vector<bool,_std::allocator<bool>_>::reserve
            ((vector<bool,_std::allocator<bool>_> *)this->bin_boundaries,__n);
  sVar7 = __n;
  while( true ) {
    bVar8 = sVar7 == 0;
    sVar7 = sVar7 - 1;
    if (bVar8) {
      puVar2 = this->bin_boundaries;
      ::std::__sort<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_less_iter>
                ((puVar2->super_vector<bool,_std::allocator<bool>_>).
                 super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_start.super__Bit_iterator_base._M_p,0,
                 (puVar2->super_vector<bool,_std::allocator<bool>_>).
                 super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_finish.super__Bit_iterator_base._M_p,
                 *(uint *)((long)&(puVar2->super_vector<bool,_std::allocator<bool>_>).
                                  super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8));
      for (uVar6 = 1; this_00 = (vector<bool,_std::allocator<bool>_> *)this->bin_boundaries,
          uVar6 < (ulong)*(uint *)(this_00 + 0x18) +
                  (*(long *)(this_00 + 0x10) - *(long *)this_00) * 8; uVar6 = uVar6 + 1) {
        rVar9 = ::std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar6 - 1);
        rVar10 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)this->bin_boundaries,uVar6);
        if (((*rVar9._M_p & rVar9._M_mask) != 0) != ((*rVar10._M_p & rVar10._M_mask) == 0)) {
          vector<bool,_false>::unsafe_erase_at(this->bin_boundaries,uVar6);
          uVar6 = uVar6 - 1;
        }
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this->counts,__n + 1);
      UnifiedVectorFormat::~UnifiedVectorFormat(&bin_child_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&bin_data);
      return;
    }
    psVar1 = (bin_child_data.sel)->sel_vector;
    uVar5 = uVar6;
    if (psVar1 != (sel_t *)0x0) {
      uVar5 = (ulong)psVar1[uVar6];
    }
    if ((bin_child_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
         (unsigned_long *)0x0) &&
       ((bin_child_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
         [uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0)) break;
    uVar5 = uVar6;
    if (psVar1 != (sel_t *)0x0) {
      uVar5 = (ulong)psVar1[uVar6];
    }
    ::std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)this->bin_boundaries,
               (bool)bin_child_data.data[uVar5]);
    uVar6 = uVar6 + 1;
  }
  pBVar4 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_98,"Histogram bin entry cannot be NULL",&local_e1)
  ;
  BinderException::BinderException(pBVar4,&local_98);
  __cxa_throw(pBVar4,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void InitializeBins(Vector &bin_vector, idx_t count, idx_t pos, AggregateInputData &aggr_input) {
		bin_boundaries = new unsafe_vector<T>();
		counts = new unsafe_vector<idx_t>();
		UnifiedVectorFormat bin_data;
		bin_vector.ToUnifiedFormat(count, bin_data);
		auto bin_counts = UnifiedVectorFormat::GetData<list_entry_t>(bin_data);
		auto bin_index = bin_data.sel->get_index(pos);
		auto bin_list = bin_counts[bin_index];
		if (!bin_data.validity.RowIsValid(bin_index)) {
			throw BinderException("Histogram bin list cannot be NULL");
		}

		auto &bin_child = ListVector::GetEntry(bin_vector);
		auto bin_count = ListVector::GetListSize(bin_vector);
		UnifiedVectorFormat bin_child_data;
		auto extra_state = OP::CreateExtraState(bin_count);
		OP::PrepareData(bin_child, bin_count, extra_state, bin_child_data);

		bin_boundaries->reserve(bin_list.length);
		for (idx_t i = 0; i < bin_list.length; i++) {
			auto bin_child_idx = bin_child_data.sel->get_index(bin_list.offset + i);
			if (!bin_child_data.validity.RowIsValid(bin_child_idx)) {
				throw BinderException("Histogram bin entry cannot be NULL");
			}
			bin_boundaries->push_back(OP::template ExtractValue<T>(bin_child_data, bin_list.offset + i, aggr_input));
		}
		// sort the bin boundaries
		std::sort(bin_boundaries->begin(), bin_boundaries->end());
		// ensure there are no duplicate bin boundaries
		for (idx_t i = 1; i < bin_boundaries->size(); i++) {
			if (Equals::Operation((*bin_boundaries)[i - 1], (*bin_boundaries)[i])) {
				bin_boundaries->erase_at(i);
				i--;
			}
		}

		counts->resize(bin_list.length + 1);
	}